

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-vm.c
# Opt level: O2

InterpretResult run(void)

{
  byte *pbVar1;
  InterpretResult IVar2;
  DoubleUnion data_4;
  DoubleUnion data;
  ObjString *a;
  ObjString *b;
  Value value;
  Value value_1;
  
  pbVar1 = *(byte **)&rules[(long)vm.frameCount + 0x27].precedence;
  *(byte **)&rules[(long)vm.frameCount + 0x27].precedence = pbVar1 + 1;
  IVar2 = (*(code *)(&PTR_DAT_0010acb0)[*pbVar1])();
  return IVar2;
}

Assistant:

static InterpretResult run() {
    const void* dispatch_table[] = {
            &&GOTO_OP_CONSTANT,
            &&GOTO_OP_NIL,
            &&GOTO_OP_TRUE,
            &&GOTO_OP_FALSE,
            &&GOTO_OP_POP,
            &&GOTO_OP_GET_LOCAL,
            &&GOTO_OP_GET_GLOBAL,
            &&GOTO_OP_DEFINE_GLOBAL,
            &&GOTO_OP_SET_LOCAL,
            &&GOTO_OP_SET_GLOBAL,
            &&GOTO_OP_GET_UPVALUE,
            &&GOTO_OP_SET_UPVALUE,
            &&GOTO_OP_GET_PROPERTY,
            &&GOTO_OP_SET_PROPERTY,
            &&GOTO_OP_GET_SUPER,
            &&GOTO_OP_EQUAL,
            &&GOTO_OP_GREATER,
            &&GOTO_OP_LESS,
            &&GOTO_OP_ADD,
            &&GOTO_OP_SUBTRACT,
            &&GOTO_OP_MULTIPLY,
            &&GOTO_OP_DIVIDE,
            &&GOTO_OP_NOT,
            &&GOTO_OP_NEGATE,
            &&GOTO_OP_PRINT,
            &&GOTO_OP_JUMP,
            &&GOTO_OP_JUMP_IF_FALSE,
            &&GOTO_OP_LOOP,
            &&GOTO_OP_CALL,
            &&GOTO_OP_INVOKE,
            &&GOTO_OP_SUPER_INVOKE,
            &&GOTO_OP_CLOSURE,
            &&GOTO_OP_CLOSE_UPVALUE,
            &&GOTO_OP_RETURN,
            &&GOTO_OP_CLASS,
            &&GOTO_OP_INHERIT,
            &&GOTO_OP_METHOD,
    };

    CallFrame *frame = &vm.frames[vm.frameCount - 1];
#define DISPATCH() goto *dispatch_table[*frame->ip++];
#define READ_BYTE() (*frame->ip++)
#define READ_SHORT() \
    (frame->ip += 2, (uint16_t)((frame->ip[-2] << 8) | frame->ip[-1]))
#define READ_CONSTANT() \
    (frame->closure->function->chunk.constants.values[READ_BYTE()])
#define READ_STRING() AS_STRING(READ_CONSTANT())
#define BINARY_OP(valueType, op) \
    do { \
      if (!IS_NUMBER(peek(0)) || !IS_NUMBER(peek(1))) { \
        runtimeError("Operands must be numbers."); \
        return INTERPRET_RUNTIME_ERROR; \
      } \
      \
      double b = AS_NUMBER(pop()); \
      double a = AS_NUMBER(pop()); \
      push(valueType(a op b)); \
    } while (false)

    while (true) {
#ifdef DEBUG_TRACE_EXECUTION
        printf("          ");
        for (Value *slot = vm.stack; slot < vm.stackTop; slot++) {
            printf("[ ");
            printValue(*slot);
            printf(" ]");
        }
        printf("\n");
        disassembleInstruction(&frame->closure->function->chunk,
        (int)(frame->ip - frame->closure->function->chunk.code));
        printf("\n");
#endif
        DISPATCH();

        GOTO_OP_CONSTANT:
        {
            Value constant = READ_CONSTANT();
            push(constant);
            DISPATCH();
        }
        GOTO_OP_NIL:
        {
            push(NIL_VAL);
            DISPATCH();
        }
        GOTO_OP_TRUE:
        {
            push(BOOL_VAL(true));
            DISPATCH();
        }
        GOTO_OP_FALSE:
        {
            push(BOOL_VAL(false));
            DISPATCH();
        }
        GOTO_OP_POP:
        {
            pop();
            DISPATCH();
        }
        GOTO_OP_GET_LOCAL:
        {
            uint8_t slot = READ_BYTE();
            push(frame->slots[slot]);
            DISPATCH();
        }
        GOTO_OP_GET_GLOBAL:
        {
            ObjString *name = READ_STRING();
            Value value;
            if (!tableGet(&vm.globals, name, &value)) {
                runtimeError("Undefined variable '%s'.", name->chars);
                return INTERPRET_RUNTIME_ERROR;
            }
            push(value);
            DISPATCH();
        }
        GOTO_OP_DEFINE_GLOBAL:
        {
            ObjString *name = READ_STRING();
            tableSet(&vm.globals, name, peek(0));
            pop();
            DISPATCH();
        }
        GOTO_OP_SET_LOCAL:
        {
            uint8_t slot = READ_BYTE();
            frame->slots[slot] = peek(0);
            DISPATCH();
        }
        GOTO_OP_SET_GLOBAL:
        {
            ObjString *name = READ_STRING();
            if (tableSet(&vm.globals, name, peek(0))) {
                tableDelete(&vm.globals, name);
                runtimeError("Undefined variable '%s'.", name->chars);
                return INTERPRET_RUNTIME_ERROR;
            }
            DISPATCH()
        }
        GOTO_OP_GET_UPVALUE:
        {
            uint8_t slot = READ_BYTE();
            push(*frame->closure->upvalues[slot]->location);
            DISPATCH();
        }
        GOTO_OP_SET_UPVALUE:
        {
            uint8_t slot = READ_BYTE();
            *frame->closure->upvalues[slot]->location = peek(0);
            DISPATCH();
        }
        GOTO_OP_GET_PROPERTY:
        {
            //Assert that only instances are allowed to have fields
            if (!IS_INSTANCE(peek(0))) {
                runtimeError("Only instances have properties.");
                return INTERPRET_RUNTIME_ERROR;
            }

            ObjInstance *instance = AS_INSTANCE(peek(0));
            ObjString *name = READ_STRING();

            Value value;
            if (tableGet(&instance->fields, name, &value)) {
                pop(); // Instance.
                push(value);
                DISPATCH();
            }
            if (!bindMethod(instance->classObj, name)) {
                return INTERPRET_RUNTIME_ERROR;
            }
        }
        GOTO_OP_SET_PROPERTY:
        {
            //Assert that only instances are allowed to have fields
            if (!IS_INSTANCE(peek(1))) {
                runtimeError("Only instances have fields.");
                return INTERPRET_RUNTIME_ERROR;
            }
            ObjInstance *instance = AS_INSTANCE(peek(1));
            tableSet(&instance->fields, READ_STRING(), peek(0));

            Value value = pop();
            pop();
            push(value);
            DISPATCH();
        }
        GOTO_OP_GET_SUPER:
        {
            ObjString *name = READ_STRING();
            ObjClass *superclass = AS_CLASS(pop());
            if (!bindMethod(superclass, name)) {
                return INTERPRET_RUNTIME_ERROR;
            }
            DISPATCH();
        }
        GOTO_OP_EQUAL:
        {
            Value b = pop();
            Value a = pop();
            push(BOOL_VAL(valuesEqual(a, b)));
            DISPATCH();
        }
        GOTO_OP_GREATER:
        {
            BINARY_OP(BOOL_VAL, >);
            DISPATCH();
        }
        GOTO_OP_LESS:
        {
            BINARY_OP(BOOL_VAL, <);
            DISPATCH();
        }
        GOTO_OP_ADD:
        {
            if (IS_STRING(peek(0)) && IS_STRING(peek(1))) {
                concatenate();
            } else if (IS_NUMBER(peek(0)) && IS_NUMBER(peek(1))) {
                double b = AS_NUMBER(pop());
                double a = AS_NUMBER(pop());
                push(NUMBER_VAL(a + b));
            } else {
                runtimeError("Operands must be two numbers or two strings.");
                return INTERPRET_RUNTIME_ERROR;
            }
            DISPATCH();
        }
        GOTO_OP_SUBTRACT:
        {
            BINARY_OP(NUMBER_VAL, -);
            DISPATCH();
        }
        GOTO_OP_MULTIPLY:
        {
            BINARY_OP(NUMBER_VAL, *);
            DISPATCH();
        }
        GOTO_OP_DIVIDE:
        {
            BINARY_OP(NUMBER_VAL, /);
            DISPATCH();
        }
        GOTO_OP_NOT:
        {
            push(BOOL_VAL(isFalsey(pop())));
            DISPATCH();
        }
        GOTO_OP_NEGATE:
        {
            if (!IS_NUMBER(peek(0))) {
                runtimeError("Operand must be a number.");
                return INTERPRET_RUNTIME_ERROR;
            }
            push(NUMBER_VAL(-AS_NUMBER(pop())));
            DISPATCH();
        }
        GOTO_OP_PRINT:
        {
            printValue(pop());
            printf("\n");
            DISPATCH();
        }
        GOTO_OP_JUMP:
        {
            uint16_t offset = READ_SHORT();
            frame->ip += offset;
            DISPATCH();
        }
        GOTO_OP_JUMP_IF_FALSE:
        {
            uint16_t offset = READ_SHORT();
            if (isFalsey(peek(0))) frame->ip += offset;
            DISPATCH();
        }
        GOTO_OP_LOOP:
        {
            uint16_t offset = READ_SHORT();
            frame->ip -= offset;
            DISPATCH();
        }
        GOTO_OP_CALL:
        {
            int argCount = READ_BYTE();
            if (!callValue(peek(argCount), argCount)) {
                return INTERPRET_RUNTIME_ERROR;
            }
            frame = &vm.frames[vm.frameCount - 1];
            DISPATCH();
        }
        GOTO_OP_INVOKE:
        {
            ObjString *method = READ_STRING();
            int argCount = READ_BYTE();
            if (!invoke(method, argCount)) {
                return INTERPRET_RUNTIME_ERROR;
            }
            frame = &vm.frames[vm.frameCount - 1];
            DISPATCH();
        }
        GOTO_OP_SUPER_INVOKE:
        {
            ObjString *method = READ_STRING();
            int argCount = READ_BYTE();
            ObjClass *superclass = AS_CLASS(pop());
            if (!invokeFromClass(superclass, method, argCount)) {
                return INTERPRET_RUNTIME_ERROR;
            }
            frame = &vm.frames[vm.frameCount - 1];
            DISPATCH();
        }
        GOTO_OP_CLOSURE:
        {
            ObjFunction *function = AS_FUNCTION(READ_CONSTANT());
            ObjClosure *closure = newClosure(function);
            push(OBJ_VAL(closure));

            for (int i = 0; i < closure->upvalueCount; i++) {
                uint8_t isLocal = READ_BYTE();
                uint8_t index = READ_BYTE();
                if (isLocal) {
                    closure->upvalues[i] = captureUpvalue(frame->slots + index);
                } else {
                    closure->upvalues[i] = frame->closure->upvalues[index];
                }
            }
            DISPATCH();
        }
        GOTO_OP_CLOSE_UPVALUE:
        {
            closeUpvalues(vm.stackTop - 1);
            pop();
            DISPATCH();
        }
        GOTO_OP_RETURN:
        {
            Value result = pop();

            closeUpvalues(frame->slots);

            vm.frameCount--;
            if (vm.frameCount == 0) return INTERPRET_OK;

            vm.stackTop = frame->slots;
            push(result);

            frame = &vm.frames[vm.frameCount - 1];
            DISPATCH();
        }
        GOTO_OP_CLASS:
        {
            push(OBJ_VAL(newClass(READ_STRING())));
            DISPATCH();
        }
        GOTO_OP_INHERIT:
        {
            Value superclass = peek(1);

            //assert that super class is ObjClass
            if (!IS_CLASS(superclass)) {
                runtimeError("Superclass must be a class.");
                return INTERPRET_RUNTIME_ERROR;
            }

            ObjClass *subclass = AS_CLASS(peek(0));

            //copy-down inheritance technique
            tableAddAll(&AS_CLASS(superclass)->methods, &subclass->methods);
            pop(); // Subclass.
            DISPATCH();
        }
        GOTO_OP_METHOD:
        {
            defineMethod(READ_STRING());
            DISPATCH();
        }
#undef READ_BYTE
#undef READ_CONSTANT
#undef READ_SHORT
#undef READ_STRING
#undef BINARY_OP
    }
}